

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerSPH.cpp
# Opt level: O1

void __thiscall chrono::ChProximityContainerSPH::AccumulateStep1(ChProximityContainerSPH *this)

{
  double __x;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  for (p_Var3 = (this->proximitylist).
                super__List_base<chrono::ChProximitySPH_*,_std::allocator<chrono::ChProximitySPH_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&this->proximitylist; p_Var3 = p_Var3->_M_next) {
    lVar4 = (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x18))();
    if (*(long *)(lVar4 + 0x10) == 0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(*(long *)(lVar4 + 0x10),&ChContactable::typeinfo,
                                      &ChNodeSPH::typeinfo,0x50);
    }
    lVar4 = (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x20))();
    plVar6 = (long *)__dynamic_cast(*(undefined8 *)(lVar4 + 0x10),&ChContactable::typeinfo,
                                    &ChNodeSPH::typeinfo,0x50);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = ((double)plVar6[2] - (double)plVar5[2]) * ((double)plVar6[2] - (double)plVar5[2])
    ;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (double)plVar6[1] - (double)plVar5[1];
    auVar9 = vfmadd231sd_fma(auVar9,auVar18,auVar18);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (double)plVar6[3] - (double)plVar5[3];
    auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
    if (auVar9._0_8_ < 0.0) {
      dVar7 = sqrt(auVar9._0_8_);
    }
    else {
      auVar9 = vsqrtsd_avx(auVar9,auVar9);
      dVar7 = auVar9._0_8_;
    }
    __x = (double)plVar5[0x1e];
    dVar17 = 0.0;
    if (dVar7 < __x) {
      dVar8 = pow(__x,9.0);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = __x;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar7 * dVar7;
      auVar9 = vfmsub231sd_fma(auVar10,auVar14,auVar14);
      dVar17 = pow(auVar9._0_8_,3.0);
      dVar17 = dVar17 * (315.0 / (dVar8 * 201.06192982974676));
    }
    auVar11._0_8_ = (**(code **)(*plVar6 + 0x90))(plVar6);
    auVar11._8_56_ = extraout_var;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar17;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = plVar5[0x1d];
    auVar9 = vfmadd213sd_fma(auVar11._0_16_,auVar15,auVar1);
    plVar5[0x1d] = auVar9._0_8_;
    auVar12._0_8_ = (**(code **)(*plVar5 + 0x90))(plVar5);
    auVar12._8_56_ = extraout_var_00;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar17;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = plVar6[0x1d];
    auVar9 = vfmadd213sd_fma(auVar12._0_16_,auVar16,auVar2);
    plVar6[0x1d] = auVar9._0_8_;
  }
  return;
}

Assistant:

void ChProximityContainerSPH::AccumulateStep1() {
    // Per-edge data computation
    std::list<ChProximitySPH*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        ChNodeSPH* mnodeA = dynamic_cast<ChNodeSPH*>((*iterproximity)->GetModelA()->GetContactable());
        ChNodeSPH* mnodeB = dynamic_cast<ChNodeSPH*>((*iterproximity)->GetModelB()->GetContactable());

        ChVector<> x_A = mnodeA->GetPos();
        ChVector<> x_B = mnodeB->GetPos();

        ChVector<> r_BA = x_B - x_A;
        double dist_BA = r_BA.Length();

        double W_k_poly6 = W_poly6(dist_BA, mnodeA->GetKernelRadius());

        // increment data of connected nodes

        mnodeA->density += mnodeB->GetMass() * W_k_poly6;
        mnodeB->density += mnodeA->GetMass() * W_k_poly6;

        ++iterproximity;
    }
}